

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O2

void __thiscall ProjectBuilderSubDirs::~ProjectBuilderSubDirs(ProjectBuilderSubDirs *this)

{
  QMakeProject *this_00;
  
  if (this->autoDelete == true) {
    this_00 = this->project;
    if (this_00 != (QMakeProject *)0x0) {
      QMakeProject::~QMakeProject(this_00);
    }
    operator_delete(this_00,0x2e0);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->subdir).d);
  return;
}

Assistant:

~ProjectBuilderSubDirs() {
        if(autoDelete)
            delete project;
    }